

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

uint32_t verify_miniscript_and_v_property(uint32_t x_property,uint32_t y_property)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = y_property | x_property;
  uVar3 = uVar2 * 2 & uVar2 & 0x200 |
          x_property * 4 & y_property & 0x400 |
          (int)(x_property << 0x1e) >> 0x1f & y_property & 7 |
          uVar2 & 0x3c8000 |
          y_property & x_property & 0x10900 | y_property & 0x21000 | x_property & 0x400;
  uVar2 = uVar3 | 0x4000;
  if ((x_property & 0x8000) == 0 && (y_property & 0x4000) == 0) {
    uVar2 = uVar3;
  }
  if (((y_property & x_property) >> 0x16 & 1) != 0) {
    _Var1 = has_two_different_lock_states(x_property,y_property);
    if (!_Var1) {
      uVar2 = uVar2 | 0x400000;
    }
  }
  uVar3 = uVar2 & 0xf;
  if ((uVar2 & 0xf) != 0) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

static uint32_t verify_miniscript_and_v_property(uint32_t x_property, uint32_t y_property)
{
    uint32_t prop = 0;
    prop |= x_property & MINISCRIPT_PROPERTY_N;
    prop |= y_property & (MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X);
    prop |= x_property & y_property &
            (MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_M | MINISCRIPT_PROPERTY_Z);
    prop |= (x_property | y_property) & MINISCRIPT_PROPERTY_S;
    prop |= (x_property | y_property) & (MINISCRIPT_PROPERTY_G | MINISCRIPT_PROPERTY_H |
                                         MINISCRIPT_PROPERTY_I | MINISCRIPT_PROPERTY_J);
    if (x_property & MINISCRIPT_TYPE_V)
        prop |= y_property & (MINISCRIPT_TYPE_K | MINISCRIPT_TYPE_V | MINISCRIPT_TYPE_B);
    if (x_property & MINISCRIPT_PROPERTY_Z)
        prop |= y_property & MINISCRIPT_PROPERTY_N;
    if ((x_property | y_property) & MINISCRIPT_PROPERTY_Z)
        prop |= (x_property | y_property) & MINISCRIPT_PROPERTY_O;
    if ((y_property & MINISCRIPT_PROPERTY_F) || (x_property & MINISCRIPT_PROPERTY_S))
        prop |= MINISCRIPT_PROPERTY_F;
    if ((x_property & y_property & MINISCRIPT_PROPERTY_K) &&
        !has_two_different_lock_states(x_property, y_property))
        prop |= MINISCRIPT_PROPERTY_K;
    if (!(prop & MINISCRIPT_TYPE_MASK))
        return 0;

    return prop;
}